

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall Message::EnqueueMessage(Message *this,char *msg)

{
  int iVar1;
  size_t __n;
  char *msg_local;
  Message *this_local;
  
  sem_wait((sem_t *)&this->_full);
  sem_wait((sem_t *)this);
  this->_current = this->_current + 1;
  memset(this->_messages + this->_current,0,0x14);
  iVar1 = this->_current;
  __n = strlen(msg);
  memcpy(this->_messages + iVar1,msg,__n);
  sem_post((sem_t *)this);
  sem_post((sem_t *)&this->_empty);
  return;
}

Assistant:

void Message::EnqueueMessage(const char *msg)
{
    sem_wait(&_full);
    sem_wait(&_lock);
    _current += 1;
    bzero(&_messages[_current], MaxMessageSize*sizeof(char));
    memcpy(&_messages[_current], msg, strlen(msg)*sizeof(char));
    sem_post(&_lock);
    sem_post(&_empty);
}